

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

void sysbvm_functionCallFrameStack_begin
               (sysbvm_context_t *context,sysbvm_functionCallFrameStack_t *callFrameStack,
               sysbvm_tuple_t function,size_t argumentCount,sysbvm_bitflags_t applicationFlags)

{
  uint uVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  byte bVar4;
  bool bVar5;
  undefined7 uVar6;
  ulong uVar7;
  bool bVar8;
  sysbvm_context_t *context_00;
  
  (callFrameStack->gcRoots).function = function;
  bVar8 = (function & 0xf) != 0;
  context_00 = context;
  if (bVar8 || function == 0) {
LAB_001127e4:
    bVar4 = 0;
  }
  else {
    uVar7 = *(ulong *)function;
    uVar6 = (undefined7)((ulong)context >> 8);
    bVar5 = (uVar7 & 0xf) != 0 || uVar7 == 0;
    context_00 = (sysbvm_context_t *)CONCAT71(uVar6,bVar5);
    if ((bVar5) || ((*(byte *)(uVar7 + 8) & 0x80) != 0)) {
      uVar1 = 0;
    }
    else {
      uVar7 = *(ulong *)(uVar7 + 0x70);
      context_00 = (sysbvm_context_t *)CONCAT71(uVar6,uVar7 != 0);
      if (uVar7 != 0 && (uVar7 & 0xf) == 0) {
        uVar1 = (uint)*(undefined8 *)(uVar7 + 0x10);
      }
      else {
        uVar1 = (uint)((long)uVar7 >> 4);
      }
    }
    if ((uVar1 >> 0xc & 1) == 0) goto LAB_001127e4;
    uVar7 = *(ulong *)(function + 0x28);
    context_00 = (sysbvm_context_t *)CONCAT71((int7)((ulong)context_00 >> 8),uVar7 != 0);
    if (uVar7 != 0 && (uVar7 & 0xf) == 0) {
      bVar4 = (byte)*(undefined8 *)(uVar7 + 0x10);
    }
    else {
      bVar4 = (byte)((long)uVar7 >> 4);
    }
  }
  callFrameStack->isVariadic = (_Bool)(bVar4 >> 1 & 1);
  if (!bVar8 && function != 0) {
    uVar7 = *(ulong *)function;
    if (((uVar7 & 0xf) == 0 && uVar7 != 0) && ((*(byte *)(uVar7 + 8) & 0x80) == 0)) {
      uVar7 = *(ulong *)(uVar7 + 0x70);
      if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
        uVar1 = (uint)((long)uVar7 >> 4);
      }
      else {
        uVar1 = (uint)*(undefined8 *)(uVar7 + 0x10);
      }
    }
    else {
      uVar1 = 0;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar7 = *(ulong *)(function + 0x28);
      if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
        uVar7 = (long)uVar7 >> 4;
      }
      else {
        uVar7 = *(ulong *)(uVar7 + 0x10);
      }
      goto LAB_00112839;
    }
  }
  uVar7 = 0;
LAB_00112839:
  callFrameStack->isMemoizedTemplate = (uVar7 & 0x600) == 0x600;
  callFrameStack->applicationFlags = applicationFlags;
  sVar2 = sysbvm_function_getArgumentCount(context_00,function);
  callFrameStack->expectedArgumentCount = sVar2;
  callFrameStack->variadicArgumentIndex = 0;
  callFrameStack->argumentIndex = 0;
  if ((applicationFlags & 3) != 0) {
    callFrameStack->isVariadic = false;
  }
  if ((int)(uVar7 & 0x600) == 0x600) {
    if (sVar2 == 0) {
      sysbvm_error("Memoized template function requires at least a single argument.");
    }
    callFrameStack->expectedArgumentCount = callFrameStack->expectedArgumentCount - 1;
    sVar2 = sVar2 - 1;
  }
  if (callFrameStack->isVariadic == true) {
    if (sVar2 == 0) {
      sysbvm_error("Variadic functions require at least a single argument.");
    }
    uVar7 = sVar2 - 1;
    callFrameStack->variadicArgumentIndex = uVar7;
    if (argumentCount < uVar7) {
      sysbvm_error("Missing required argument count.");
    }
    sVar3 = sysbvm_array_create(context,argumentCount - uVar7);
    (callFrameStack->gcRoots).applicationArguments[callFrameStack->variadicArgumentIndex] = sVar3;
  }
  else if (sVar2 != argumentCount) {
    sysbvm_error("Function call does not receive the required number of arguments.");
  }
  if ((0x10 < argumentCount) && (callFrameStack->isVariadic == false)) {
    sysbvm_error("Function application direct arguments exceeds the max argument count.");
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionCallFrameStack_begin(sysbvm_context_t *context, sysbvm_functionCallFrameStack_t *callFrameStack, sysbvm_tuple_t function, size_t argumentCount, sysbvm_bitflags_t applicationFlags)
{
    callFrameStack->gcRoots.function = function;
    callFrameStack->isVariadic = sysbvm_function_isVariadic(context, callFrameStack->gcRoots.function);
    callFrameStack->isMemoizedTemplate = sysbvm_function_isMemoizedTemplate(context, callFrameStack->gcRoots.function);
    callFrameStack->applicationFlags = applicationFlags;
    callFrameStack->expectedArgumentCount = sysbvm_function_getArgumentCount(context, callFrameStack->gcRoots.function);
    callFrameStack->argumentIndex = 0;
    callFrameStack->variadicArgumentIndex = 0;

    if(applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK))
        callFrameStack->isVariadic = false;

    size_t requiredArgumentCount = callFrameStack->expectedArgumentCount;
    if(callFrameStack->isMemoizedTemplate)
    {
        if(callFrameStack->expectedArgumentCount == 0)
            sysbvm_error("Memoized template function requires at least a single argument.");
        --callFrameStack->expectedArgumentCount;
        --requiredArgumentCount;
    }

    if(callFrameStack->isVariadic)
    {
        if(requiredArgumentCount == 0)
            sysbvm_error("Variadic functions require at least a single argument.");
        callFrameStack->variadicArgumentIndex = requiredArgumentCount - 1;

        --requiredArgumentCount;
        if(argumentCount < requiredArgumentCount)
            sysbvm_error("Missing required argument count.");

        size_t variadicArgumentCount = argumentCount - requiredArgumentCount;
        callFrameStack->gcRoots.applicationArguments[callFrameStack->variadicArgumentIndex] = sysbvm_array_create(context, variadicArgumentCount);
    }
    else
    {
        if(argumentCount != requiredArgumentCount)
            sysbvm_error("Function call does not receive the required number of arguments.");
    }

    if(argumentCount > SYSBVM_MAX_FUNCTION_ARGUMENTS && !callFrameStack->isVariadic)
        sysbvm_error("Function application direct arguments exceeds the max argument count.");
    
}